

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalAnyJoin::Deserialize(LogicalAnyJoin *this,Deserializer *deserializer)

{
  JoinType type;
  uint uVar1;
  int iVar2;
  LogicalAnyJoin *this_00;
  pointer pLVar3;
  undefined4 extraout_var;
  byte bVar5;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var6;
  unique_ptr<duckdb::LogicalAnyJoin,_std::default_delete<duckdb::LogicalAnyJoin>,_true> result;
  string str;
  _Head_base<0UL,_duckdb::LogicalAnyJoin_*,_false> local_50;
  undefined1 local_48 [32];
  idx_t iVar4;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"join_type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_48,deserializer);
    type = EnumUtil::FromString<duckdb::JoinType>((char *)local_48._0_8_);
    if ((Expression *)local_48._0_8_ != (Expression *)(local_48 + 0x10)) {
      operator_delete((void *)local_48._0_8_);
    }
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    type = (JoinType)iVar2;
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  this_00 = (LogicalAnyJoin *)operator_new(0xc0);
  LogicalAnyJoin(this_00,type);
  local_50._M_head_impl = this_00;
  pLVar3 = unique_ptr<duckdb::LogicalAnyJoin,_std::default_delete<duckdb::LogicalAnyJoin>,_true>::
           operator->((unique_ptr<duckdb::LogicalAnyJoin,_std::default_delete<duckdb::LogicalAnyJoin>,_true>
                       *)&local_50);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"mark_index");
  if ((char)uVar1 == '\0') {
    iVar4 = 0;
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar4 = CONCAT44(extraout_var,iVar2);
  }
  (pLVar3->super_LogicalJoin).mark_index = iVar4;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  pLVar3 = unique_ptr<duckdb::LogicalAnyJoin,_std::default_delete<duckdb::LogicalAnyJoin>,_true>::
           operator->((unique_ptr<duckdb::LogicalAnyJoin,_std::default_delete<duckdb::LogicalAnyJoin>,_true>
                       *)&local_50);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (deserializer,0xca,"left_projection_map",
             &(pLVar3->super_LogicalJoin).left_projection_map);
  pLVar3 = unique_ptr<duckdb::LogicalAnyJoin,_std::default_delete<duckdb::LogicalAnyJoin>,_true>::
           operator->((unique_ptr<duckdb::LogicalAnyJoin,_std::default_delete<duckdb::LogicalAnyJoin>,_true>
                       *)&local_50);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (deserializer,0xcb,"right_projection_map",
             &(pLVar3->super_LogicalJoin).right_projection_map);
  pLVar3 = unique_ptr<duckdb::LogicalAnyJoin,_std::default_delete<duckdb::LogicalAnyJoin>,_true>::
           operator->((unique_ptr<duckdb::LogicalAnyJoin,_std::default_delete<duckdb::LogicalAnyJoin>,_true>
                       *)&local_50);
  iVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcc,"condition");
  bVar5 = (byte)iVar2;
  if (bVar5 == 0) {
    _Var6._M_head_impl =
         (pLVar3->condition).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pLVar3->condition).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    if (_Var6._M_head_impl == (Expression *)0x0) {
      bVar5 = 0;
      goto LAB_010abb14;
    }
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar2 == '\0') {
      local_48._0_8_ = (Expression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      Expression::Deserialize((Expression *)local_48,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var6._M_head_impl =
         (pLVar3->condition).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pLVar3->condition).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)local_48._0_8_;
    if (_Var6._M_head_impl == (Expression *)0x0) {
      bVar5 = 1;
      goto LAB_010abb14;
    }
  }
  (*((_Var6._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
LAB_010abb14:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar5);
  (this->super_LogicalJoin).super_LogicalOperator._vptr_LogicalOperator =
       (_func_int **)local_50._M_head_impl;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalAnyJoin::Deserialize(Deserializer &deserializer) {
	auto join_type = deserializer.ReadProperty<JoinType>(200, "join_type");
	auto result = duckdb::unique_ptr<LogicalAnyJoin>(new LogicalAnyJoin(join_type));
	deserializer.ReadPropertyWithDefault<idx_t>(201, "mark_index", result->mark_index);
	deserializer.ReadPropertyWithDefault<vector<idx_t>>(202, "left_projection_map", result->left_projection_map);
	deserializer.ReadPropertyWithDefault<vector<idx_t>>(203, "right_projection_map", result->right_projection_map);
	deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(204, "condition", result->condition);
	return std::move(result);
}